

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtmg(fitsfile *infptr,fitsfile *outfptr,int mgopt,int *status)

{
  int iVar1;
  bool bVar2;
  fitsfile *local_48;
  fitsfile *tmpfptr;
  long nmembers;
  long i;
  int *status_local;
  fitsfile *pfStack_20;
  int mgopt_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  tmpfptr = (fitsfile *)0x0;
  local_48 = (fitsfile *)0x0;
  if (*status == 0) {
    i = (long)status;
    status_local._4_4_ = mgopt;
    pfStack_20 = outfptr;
    outfptr_local = infptr;
    iVar1 = ffgtnm(infptr,(long *)&tmpfptr,status);
    *(int *)i = iVar1;
    nmembers = 1;
    while( true ) {
      bVar2 = false;
      if (nmembers <= (long)tmpfptr) {
        bVar2 = *(int *)i == 0;
      }
      if (!bVar2) break;
      iVar1 = ffgmop(outfptr_local,nmembers,&local_48,(int *)i);
      *(int *)i = iVar1;
      iVar1 = ffgtam(pfStack_20,local_48,0,(int *)i);
      *(int *)i = iVar1;
      if (*(int *)i == 0x155) {
        *(undefined4 *)i = 0;
      }
      if (local_48 != (fitsfile *)0x0) {
        ffclos(local_48,(int *)i);
        local_48 = (fitsfile *)0x0;
      }
      nmembers = nmembers + 1;
    }
    if ((*(int *)i == 0) && (status_local._4_4_ == 1)) {
      iVar1 = ffgtrm(outfptr_local,0,(int *)i);
      *(int *)i = iVar1;
    }
    if (local_48 != (fitsfile *)0x0) {
      ffclos(local_48,(int *)i);
    }
    infptr_local._4_4_ = *(int *)i;
  }
  else {
    infptr_local._4_4_ = *status;
  }
  return infptr_local._4_4_;
}

Assistant:

int ffgtmg(fitsfile *infptr,  /* FITS file ptr to source grouping table      */
	   fitsfile *outfptr, /* FITS file ptr to target grouping table      */
	   int       mgopt,   /* code specifying merge options:
				 OPT_MRG_COPY (0) ==> copy members to target
				                      group, leaving source 
						      group in place
				 OPT_MRG_MOV  (1) ==> move members to target
				                      group, source group is
						      deleted after merge    */
	   int      *status)   /* return status code                         */
     

/*
  merge two grouping tables by combining their members into a single table. 
  The source grouping table must be the CHDU of the fitsfile pointed to by 
  infptr, and the target grouping table must be the CHDU of the fitsfile to by 
  outfptr. All members of the source grouping table shall be copied to the
  target grouping table. If the mgopt parameter is OPT_MRG_COPY then the source
  grouping table continues to exist after the merge. If the mgopt parameter
  is OPT_MRG_MOV then the source grouping table is deleted after the merge, 
  and all member HDUs are updated accordingly.
*/
{
  long i ;
  long nmembers = 0;

  fitsfile *tmpfptr = NULL;


  if(*status != 0) return(*status);

  do
    {

      *status = fits_get_num_members(infptr,&nmembers,status);

      for(i = 1; i <= nmembers && *status == 0; ++i)
	{
	  *status = fits_open_member(infptr,i,&tmpfptr,status);
	  *status = fits_add_group_member(outfptr,tmpfptr,0,status);

	  if(*status == HDU_ALREADY_MEMBER) *status = 0;

	  if(tmpfptr != NULL)
	    {
	      fits_close_file(tmpfptr,status);
	      tmpfptr = NULL;
	    }
	}

      if(*status != 0) continue;

      if(mgopt == OPT_MRG_MOV) 
	*status = fits_remove_group(infptr,OPT_RM_GPT,status);

    }while(0);

  if(tmpfptr != NULL)
    {
      fits_close_file(tmpfptr,status);
    }

  return(*status);
}